

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.h
# Opt level: O2

void __thiscall cmExportSet::cmExportSet(cmExportSet *this,string *name)

{
  (this->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TargetExports).super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->Name,(string *)name);
  (this->Installations).
  super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Installations).
  super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Installations).
  super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmExportSet(const std::string &name) : Name(name) {}